

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainAppValidations.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  GradeBook local_160;
  GradeBook local_140;
  allocator local_119;
  string local_118 [32];
  GradeBook local_f8;
  GradeBook local_d8;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  GradeBook gradeBook2;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  GradeBook gradeBook1;
  char **argv_local;
  int argc_local;
  
  gradeBook1._24_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"CS101 Introduction to Programming in C++",&local_59);
  GradeBook::GradeBook((GradeBook *)local_38,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"CS102 C++ Data Structures",&local_b1);
  GradeBook::GradeBook((GradeBook *)local_90,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  poVar1 = std::operator<<((ostream *)&std::cout,"gradeBook1 initial course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_d8);
  std::operator<<(poVar1,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook2 initial course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_f8);
  poVar1 = std::operator<<(poVar1,(string *)&local_f8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"CS101 C++ Programming",&local_119);
  GradeBook::setCourseName((GradeBook *)local_38,(string *)local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook1 course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_140);
  std::operator<<(poVar1,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook2 course name: ");
  GradeBook::getCourseName_abi_cxx11_(&local_160);
  poVar1 = std::operator<<(poVar1,(string *)&local_160);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_160);
  GradeBook::~GradeBook((GradeBook *)local_90);
  GradeBook::~GradeBook((GradeBook *)local_38);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    GradeBook gradeBook1("CS101 Introduction to Programming in C++");
    GradeBook gradeBook2("CS102 C++ Data Structures");

    // display each GradeBook's courseName
    std::cout << "gradeBook1 initial course name: "
              << gradeBook1.getCourseName();
    std::cout << "\ngradeBook2 initial course name: "
              << gradeBook2.getCourseName() << std::endl;

    // modify myGradeBook's courseName (with a valid length string)
    gradeBook1.setCourseName("CS101 C++ Programming");

    // display each GradeBook's courseName
    std::cout << "\ngradeBook1 course name: " << gradeBook1.getCourseName();
    std::cout << "\ngradeBook2 course name: " << gradeBook2.getCourseName()
              << std::endl;
    return 0;
}